

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_cache_bin_fill_small
               (tsdn_t *tsdn,arena_t *arena,cache_bin_t *cache_bin,szind_t binind,
               cache_bin_sz_t nfill)

{
  size_t *psVar1;
  uint64_t *puVar2;
  atomic_zu_t *paVar3;
  pac_decay_stats_t *ppVar4;
  locked_u64_t *plVar5;
  pac_stats_t *ppVar6;
  pa_shard_stats_t *ppVar7;
  pthread_mutex_t *__mutex;
  batcher_t *batcher;
  void *__src;
  char cVar8;
  int iVar9;
  void **ppvVar10;
  edata_t *slab;
  void **ppvVar11;
  arena_t *paVar12;
  _Bool _Var13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  ulong uVar18;
  edata_t *slab_00;
  uint64_t uVar19;
  ulong uVar20;
  bin_t *bin_info;
  bin_t *extraout_RDX;
  bin_t *extraout_RDX_00;
  bin_t *extraout_RDX_01;
  bin_t *pbVar21;
  bin_t *extraout_RDX_02;
  bin_t *extraout_RDX_03;
  bin_t *extraout_RDX_04;
  bin_t *extraout_RDX_05;
  bin_t *extraout_RDX_06;
  ulong uVar22;
  long *plVar23;
  arena_t *paVar24;
  undefined6 in_register_00000082;
  mutex_prof_data_t *data;
  size_t sVar25;
  arena_t *paVar26;
  ulong local_228;
  uint local_214;
  size_t local_208;
  undefined8 auStack_188 [8];
  undefined4 local_148;
  arena_t *local_140;
  long local_138 [33];
  
  ppvVar10 = cache_bin->stack_head;
  iVar9 = *(int *)&cache_bin->low_bits_empty;
  uVar20 = 0;
  if ((tsdn != (tsdn_t *)0x0) &&
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena != (arena_t *)0x0)) {
    uVar20 = (ulong)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                    binshard[binind];
  }
  bin_info = (bin_t *)(duckdb_je_bin_infos + binind);
  uVar16 = duckdb_je_arena_bin_offsets[binind];
  uVar22 = (ulong)((uint)uVar20 << 8);
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    uVar22 = uVar20 * 0x288;
  }
  paVar12 = (arena_t *)((long)&arena->nthreads[0].repr + uVar22 + uVar16);
  __mutex = (pthread_mutex_t *)
            ((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr + uVar16 + uVar22);
  batcher = (batcher_t *)((long)&(arena->stats).mutex_prof_data[0].max_n_thds + uVar22 + uVar16);
  __src = (void *)((long)&(arena->stats).mutex_prof_data[2].n_owner_switches + uVar22 + uVar16);
  local_228 = CONCAT71((int7)((ulong)__src >> 8),1);
  local_214 = (uint)local_228;
  uVar22 = 0;
  slab_00 = (edata_t *)0x0;
  while( true ) {
    iVar14 = pthread_mutex_trylock(__mutex);
    pbVar21 = extraout_RDX;
    if (iVar14 != 0) {
      duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)paVar12);
      *(undefined1 *)&(paVar12->stats).mapped = 1;
      pbVar21 = extraout_RDX_00;
    }
    psVar1 = &(paVar12->stats).metadata_thp;
    *psVar1 = *psVar1 + 1;
    if ((tsdn_t *)(paVar12->stats).resident != tsdn) {
      (paVar12->stats).resident = (size_t)tsdn;
      psVar1 = &(paVar12->stats).metadata_rtree;
      *psVar1 = *psVar1 + 1;
    }
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      uVar16 = duckdb_je_arena_binind_div_info[binind].magic;
      local_148 = 0;
      local_140 = (arena_t *)0x0;
      local_208 = duckdb_je_batcher_pop_begin(tsdn,batcher);
      if (local_208 == 0xffffffffffffffff) {
        local_228 = 0;
        local_208 = 0;
        pbVar21 = extraout_RDX_01;
      }
      else {
        sVar17 = duckdb_je_batcher_pop_get_pushes(tsdn,batcher);
        if (local_208 == 0) {
          batcher_pop_end(tsdn,batcher);
          local_228 = 0;
          pbVar21 = extraout_RDX_04;
        }
        else {
          switchD_012bc561::default(local_138,__src,local_208 << 4);
          paVar24 = (arena_t *)tsdn;
          batcher_pop_end(tsdn,batcher);
          local_228 = 0;
          plVar23 = local_138 + 1;
          sVar25 = local_208;
          do {
            paVar26 = (arena_t *)*plVar23;
            uVar18 = (plVar23[-1] - *(long *)&paVar26->binshard_next) * (ulong)uVar16;
            pbVar21 = (bin_t *)(1L << ((byte)(uVar18 >> 0x20) & 0x3f));
            *(ulong *)(paVar26->nthreads + (uVar18 >> 0x26) * 2 + 0x10) =
                 *(ulong *)(paVar26->nthreads + (uVar18 >> 0x26) * 2 + 0x10) ^ (ulong)pbVar21;
            uVar18 = *(long *)paVar26->nthreads + 0x10000000;
            *(ulong *)paVar26->nthreads = uVar18;
            uVar15 = (uint)(uVar18 >> 0x1c) & 0x3ff;
            if (uVar15 == duckdb_je_bin_infos[binind].nregs) {
              duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                        ((tsdn_t *)paVar24,arena,(edata_t *)paVar26,(bin_t *)paVar12);
              pbVar21 = extraout_RDX_02;
              if ((uint)local_228 < 8) {
                auStack_188[local_228] = paVar26;
                local_228 = (ulong)((uint)local_228 + 1);
              }
              else {
                (paVar26->stats).metadata_rtree = (size_t)paVar26;
                (paVar26->stats).resident = (size_t)paVar26;
                if (local_140 != (arena_t *)0x0) {
                  (paVar26->stats).metadata_rtree = (local_140->stats).resident;
                  (local_140->stats).resident = (size_t)paVar26;
                  (paVar26->stats).resident = *(size_t *)((paVar26->stats).resident + 0x28);
                  *(arena_t **)((local_140->stats).resident + 0x28) = local_140;
                  *(arena_t **)((paVar26->stats).resident + 0x28) = paVar26;
                  paVar26 = (arena_t *)(paVar26->stats).metadata_rtree;
                }
                local_140 = paVar26;
              }
            }
            else if ((uVar15 == 1) &&
                    ((arena_t *)(paVar12->stats).mutex_prof_data[0].tot_wait_time.ns != paVar26)) {
              pbVar21 = bin_info;
              arena_bin_slabs_full_remove
                        ((arena_t *)(ulong)arena->ind,(bin_t *)paVar12,(edata_t *)paVar26);
              paVar24 = arena;
              arena_bin_lower_slab((tsdn_t *)arena,paVar26,(edata_t *)paVar12,pbVar21);
              pbVar21 = extraout_RDX_03;
            }
            plVar23 = plVar23 + 2;
            sVar25 = sVar25 - 1;
          } while (sVar25 != 0);
        }
        local_148 = (undefined4)local_228;
        paVar3 = &(paVar12->stats).pa_shard_stats.pac_stats.pac_mapped;
        paVar3->repr = paVar3->repr + 1;
        psVar1 = &(paVar12->stats).tcache_bytes;
        *psVar1 = *psVar1 + sVar17;
        psVar1 = &(paVar12->stats).tcache_stashed_bytes;
        *psVar1 = *psVar1 + local_208;
      }
    }
    while( true ) {
      do {
        while( true ) {
          if (nfill <= (ushort)uVar22) goto LAB_00ce2187;
          slab = (edata_t *)(paVar12->stats).mutex_prof_data[0].tot_wait_time.ns;
          if ((slab == (edata_t *)0x0) ||
             (uVar18 = slab->e_bits >> 0x1c, uVar16 = (uint)uVar18 & 0x3ff, (uVar18 & 0x3ff) == 0))
          break;
          iVar14 = (int)(uVar22 & 0xffff);
          uVar15 = (uint)nfill - iVar14;
          if (uVar16 <= uVar15) {
            uVar15 = uVar16;
          }
          arena_slab_reg_alloc_batch
                    (slab,(bin_info_t *)bin_info,uVar15,
                     (void **)((long)ppvVar10 +
                              (uVar22 & 0xffff) * 8 +
                              ((ulong)(iVar9 - (int)ppvVar10 & 0xffff) -
                              (ulong)(uint)((int)CONCAT62(in_register_00000082,nfill) << 3))));
          uVar22 = (ulong)(uVar15 + iVar14);
          local_214 = 1;
          pbVar21 = extraout_RDX_05;
        }
        _Var13 = arena_bin_refill_slabcur_no_fresh_slab((tsdn_t *)arena,paVar12,pbVar21);
        pbVar21 = extraout_RDX_06;
      } while (!_Var13);
      if (slab_00 == (edata_t *)0x0) break;
      ppVar4 = &(paVar12->stats).pa_shard_stats.pac_stats.decay_muzzy;
      (ppVar4->npurge).val.repr = (ppVar4->npurge).val.repr + 1;
      plVar5 = &(paVar12->stats).pa_shard_stats.pac_stats.decay_muzzy.purged;
      (plVar5->val).repr = (plVar5->val).repr + 1;
      (paVar12->stats).mutex_prof_data[0].tot_wait_time.ns = (uint64_t)slab_00;
      slab_00 = (edata_t *)0x0;
    }
    if ((local_214 & 1) == 0) break;
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      puVar2 = &(paVar12->stats).nrequests_large;
      *puVar2 = *puVar2 + local_208;
      ppVar6 = &(paVar12->stats).pa_shard_stats.pac_stats;
      (ppVar6->decay_dirty).npurge.val.repr = (ppVar6->decay_dirty).npurge.val.repr - local_208;
    }
    *(undefined1 *)&(paVar12->stats).mapped = 0;
    pthread_mutex_unlock(__mutex);
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      paVar24 = local_140;
      if ((int)local_228 != 0) {
        uVar18 = 0;
        do {
          duckdb_je_arena_slab_dalloc
                    (tsdn,(arena_t *)
                          duckdb_je_arenas[(uint)((edata_t *)auStack_188[uVar18])->e_bits & 0xfff].
                          repr,(edata_t *)auStack_188[uVar18]);
          uVar18 = uVar18 + 1;
          paVar24 = local_140;
        } while ((local_228 & 0xffffffff) != uVar18);
      }
      while (paVar24 != (arena_t *)0x0) {
        local_140 = (arena_t *)(paVar24->stats).metadata_rtree;
        if (local_140 == paVar24) {
          local_140 = (arena_t *)0x0;
        }
        else {
          *(size_t *)((paVar24->stats).resident + 0x28) = (local_140->stats).resident;
          sVar17 = (paVar24->stats).resident;
          *(size_t *)((paVar24->stats).metadata_rtree + 0x30) = sVar17;
          (paVar24->stats).resident = *(size_t *)(sVar17 + 0x28);
          sVar17 = (paVar24->stats).metadata_rtree;
          *(size_t *)(*(long *)(sVar17 + 0x30) + 0x28) = sVar17;
          *(arena_t **)((paVar24->stats).resident + 0x28) = paVar24;
        }
        paVar26 = local_140;
        duckdb_je_arena_slab_dalloc
                  (tsdn,(arena_t *)duckdb_je_arenas[paVar24->nthreads[0].repr & 0xfff].repr,
                   (edata_t *)paVar24);
        paVar24 = paVar26;
      }
    }
    slab_00 = arena_slab_alloc(tsdn,arena,binind,(uint)uVar20,(bin_info_t *)bin_info);
    local_214 = 0;
  }
  slab_00 = (edata_t *)0x0;
LAB_00ce2187:
  uVar20 = uVar22 & 0xffff;
  puVar2 = &(paVar12->stats).nflushes_large;
  *puVar2 = *puVar2 + uVar20;
  ppVar7 = &(paVar12->stats).pa_shard_stats;
  ppVar7->edata_avail = ppVar7->edata_avail + (cache_bin->tstats).nrequests;
  uVar19 = (paVar12->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr + uVar20;
  (paVar12->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr = uVar19;
  plVar5 = &(paVar12->stats).pa_shard_stats.pac_stats.decay_dirty.nmadvise;
  (plVar5->val).repr = (plVar5->val).repr + 1;
  (cache_bin->tstats).nrequests = 0;
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    puVar2 = &(paVar12->stats).nrequests_large;
    *puVar2 = *puVar2 + local_208;
    (paVar12->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr = uVar19 - local_208;
  }
  *(undefined1 *)&(paVar12->stats).mapped = 0;
  pthread_mutex_unlock(__mutex);
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    paVar12 = local_140;
    if ((int)local_228 != 0) {
      uVar18 = 0;
      do {
        duckdb_je_arena_slab_dalloc
                  (tsdn,(arena_t *)
                        duckdb_je_arenas[(uint)((edata_t *)auStack_188[uVar18])->e_bits & 0xfff].
                        repr,(edata_t *)auStack_188[uVar18]);
        uVar18 = uVar18 + 1;
        paVar12 = local_140;
      } while ((local_228 & 0xffffffff) != uVar18);
    }
    while (paVar12 != (arena_t *)0x0) {
      local_140 = (arena_t *)(paVar12->stats).metadata_rtree;
      if (local_140 == paVar12) {
        local_140 = (arena_t *)0x0;
      }
      else {
        *(size_t *)((paVar12->stats).resident + 0x28) = (local_140->stats).resident;
        sVar17 = (paVar12->stats).resident;
        *(size_t *)((paVar12->stats).metadata_rtree + 0x30) = sVar17;
        (paVar12->stats).resident = *(size_t *)(sVar17 + 0x28);
        sVar17 = (paVar12->stats).metadata_rtree;
        *(size_t *)(*(long *)(sVar17 + 0x30) + 0x28) = sVar17;
        *(arena_t **)((paVar12->stats).resident + 0x28) = paVar12;
      }
      paVar24 = local_140;
      duckdb_je_arena_slab_dalloc
                (tsdn,(arena_t *)duckdb_je_arenas[paVar12->nthreads[0].repr & 0xfff].repr,
                 (edata_t *)paVar12);
      paVar12 = paVar24;
    }
  }
  if (slab_00 != (edata_t *)0x0) {
    duckdb_je_arena_slab_dalloc(tsdn,arena,slab_00);
  }
  ppvVar11 = cache_bin->stack_head;
  uVar16 = *(int *)&cache_bin->low_bits_empty - (int)ppvVar11 & 0xffff;
  ppvVar10 = (void **)((long)ppvVar11 + uVar20 * -8 + (ulong)uVar16);
  if ((ushort)uVar22 < nfill) {
    memmove(ppvVar10,(void *)((long)ppvVar11 +
                             (CONCAT62(in_register_00000082,nfill) & 0xffffffff) * -8 +
                             (ulong)uVar16),(ulong)(uint)((int)uVar20 << 3));
  }
  cache_bin->stack_head = ppvVar10;
  if (tsdn != (tsdn_t *)0x0) {
    cVar8 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar9 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar9 + -1;
    if (iVar9 < 1) {
      if (cVar8 < '\x01') {
        uVar20 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar20;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar20 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,arena,false,false);
        return;
      }
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick = 0;
    }
  }
  return;
}

Assistant:

void
arena_cache_bin_fill_small(tsdn_t *tsdn, arena_t *arena,
    cache_bin_t *cache_bin, szind_t binind, const cache_bin_sz_t nfill) {
	assert(cache_bin_ncached_get_local(cache_bin) == 0);
	assert(nfill != 0);

	const bin_info_t *bin_info = &bin_infos[binind];

	CACHE_BIN_PTR_ARRAY_DECLARE(ptrs, nfill);
	cache_bin_init_ptr_array_for_fill(cache_bin, &ptrs, nfill);
	/*
	 * Bin-local resources are used first: 1) bin->slabcur, and 2) nonfull
	 * slabs.  After both are exhausted, new slabs will be allocated through
	 * arena_slab_alloc().
	 *
	 * Bin lock is only taken / released right before / after the while(...)
	 * refill loop, with new slab allocation (which has its own locking)
	 * kept outside of the loop.  This setup facilitates flat combining, at
	 * the cost of the nested loop (through goto label_refill).
	 *
	 * To optimize for cases with contention and limited resources
	 * (e.g. hugepage-backed or non-overcommit arenas), each fill-iteration
	 * gets one chance of slab_alloc, and a retry of bin local resources
	 * after the slab allocation (regardless if slab_alloc failed, because
	 * the bin lock is dropped during the slab allocation).
	 *
	 * In other words, new slab allocation is allowed, as long as there was
	 * progress since the previous slab_alloc.  This is tracked with
	 * made_progress below, initialized to true to jump start the first
	 * iteration.
	 *
	 * In other words (again), the loop will only terminate early (i.e. stop
	 * with filled < nfill) after going through the three steps: a) bin
	 * local exhausted, b) unlock and slab_alloc returns null, c) re-lock
	 * and bin local fails again.
	 */
	bool made_progress = true;
	edata_t *fresh_slab = NULL;
	bool alloc_and_retry = false;
	cache_bin_sz_t filled = 0;
	unsigned binshard;
	bin_t *bin = arena_bin_choose(tsdn, arena, binind, &binshard);

	/*
	 * This has some fields that are conditionally initialized down batch
	 * flush pathways.  This can trigger static analysis warnings deeper
	 * down in the static.  The accesses are guarded by the same checks as
	 * the initialization, but the analysis isn't able to track that across
	 * multiple stack frames.
	 */
	arena_bin_flush_batch_state_t batch_flush_state
	    JEMALLOC_CLANG_ANALYZER_SILENCE_INIT({0});
label_refill:
	malloc_mutex_lock(tsdn, &bin->lock);
	arena_bin_flush_batch_after_lock(tsdn, arena, bin, binind, &batch_flush_state);

	while (filled < nfill) {
		/* Try batch-fill from slabcur first. */
		edata_t *slabcur = bin->slabcur;
		if (slabcur != NULL && edata_nfree_get(slabcur) > 0) {
			unsigned tofill = nfill - filled;
			unsigned nfree = edata_nfree_get(slabcur);
			unsigned cnt = tofill < nfree ? tofill : nfree;

			arena_slab_reg_alloc_batch(slabcur, bin_info, cnt,
			    &ptrs.ptr[filled]);
			made_progress = true;
			filled += cnt;
			continue;
		}
		/* Next try refilling slabcur from nonfull slabs. */
		if (!arena_bin_refill_slabcur_no_fresh_slab(tsdn, arena, bin)) {
			assert(bin->slabcur != NULL);
			continue;
		}

		/* Then see if a new slab was reserved already. */
		if (fresh_slab != NULL) {
			arena_bin_refill_slabcur_with_fresh_slab(tsdn, arena,
			    bin, binind, fresh_slab);
			assert(bin->slabcur != NULL);
			fresh_slab = NULL;
			continue;
		}

		/* Try slab_alloc if made progress (or never did slab_alloc). */
		if (made_progress) {
			assert(bin->slabcur == NULL);
			assert(fresh_slab == NULL);
			alloc_and_retry = true;
			/* Alloc a new slab then come back. */
			break;
		}

		/* OOM. */

		assert(fresh_slab == NULL);
		assert(!alloc_and_retry);
		break;
	} /* while (filled < nfill) loop. */

	if (config_stats && !alloc_and_retry) {
		bin->stats.nmalloc += filled;
		bin->stats.nrequests += cache_bin->tstats.nrequests;
		bin->stats.curregs += filled;
		bin->stats.nfills++;
		cache_bin->tstats.nrequests = 0;
	}

	arena_bin_flush_batch_before_unlock(tsdn, arena, bin, binind,
	    &batch_flush_state);
	malloc_mutex_unlock(tsdn, &bin->lock);
	arena_bin_flush_batch_after_unlock(tsdn, arena, bin, binind,
	    &batch_flush_state);

	if (alloc_and_retry) {
		assert(fresh_slab == NULL);
		assert(filled < nfill);
		assert(made_progress);

		fresh_slab = arena_slab_alloc(tsdn, arena, binind, binshard,
		    bin_info);
		/* fresh_slab NULL case handled in the for loop. */

		alloc_and_retry = false;
		made_progress = false;
		goto label_refill;
	}
	assert(filled == nfill || (fresh_slab == NULL && !made_progress));

	/* Release if allocated but not used. */
	if (fresh_slab != NULL) {
		assert(edata_nfree_get(fresh_slab) == bin_info->nregs);
		arena_slab_dalloc(tsdn, arena, fresh_slab);
		fresh_slab = NULL;
	}

	cache_bin_finish_fill(cache_bin, &ptrs, filled);
	arena_decay_tick(tsdn, arena);
}